

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  int powersave;
  uint uVar3;
  int iVar4;
  Mat MStack_b8;
  Option local_70;
  
  uVar1 = ncnn::get_cpu_count();
  uVar3 = 0xffffffff;
  if (argc < 2) {
    iVar2 = 4;
    powersave = 0;
  }
  else {
    iVar2 = atoi(argv[1]);
    powersave = 0;
    if (argc != 2) {
      uVar1 = atoi(argv[2]);
      powersave = 0;
      if (3 < (uint)argc) {
        powersave = atoi(argv[3]);
        if (argc != 4) {
          uVar3 = atoi(argv[4]);
          if (5 < (uint)argc) {
            iVar4 = atoi(argv[5]);
            g_enable_cooling_down = iVar4 != 0;
            goto LAB_0013ab2f;
          }
        }
      }
    }
  }
  g_enable_cooling_down = true;
LAB_0013ab2f:
  g_loop_count = iVar2;
  ncnn::UnlockedPoolAllocator::set_size_compare_ratio(&g_blob_pool_allocator,0.0);
  ncnn::PoolAllocator::set_size_compare_ratio(&g_workspace_pool_allocator,0.5);
  ncnn::Option::Option(&local_70);
  local_70.use_vulkan_compute = uVar3 != 0xffffffff;
  local_70.lightmode = true;
  local_70.blob_allocator = &g_blob_pool_allocator.super_Allocator;
  local_70.workspace_allocator = &g_workspace_pool_allocator.super_Allocator;
  local_70.use_winograd_convolution = true;
  local_70.use_sgemm_convolution = true;
  local_70.use_int8_inference = true;
  local_70.use_fp16_packed = true;
  local_70.use_fp16_storage = true;
  local_70.use_fp16_arithmetic = true;
  local_70.use_int8_storage = true;
  local_70.use_int8_arithmetic = true;
  local_70.use_packing_layout = true;
  local_70.use_shader_pack8 = false;
  local_70.use_image_storage = false;
  local_70.num_threads = uVar1;
  ncnn::set_cpu_powersave(powersave);
  ncnn::set_omp_dynamic(0);
  ncnn::set_omp_num_threads(uVar1);
  fprintf(_stderr,"loop_count = %d\n",(ulong)(uint)g_loop_count);
  fprintf(_stderr,"num_threads = %d\n",(ulong)uVar1);
  __stream = _stderr;
  uVar1 = ncnn::get_cpu_powersave();
  fprintf(__stream,"powersave = %d\n",(ulong)uVar1);
  fprintf(_stderr,"gpu_device = %d\n",(ulong)uVar3);
  fprintf(_stderr,"cooling_down = %d\n",(ulong)g_enable_cooling_down);
  ncnn::Mat::Mat(&MStack_b8,0xe3,0xe3,3,4,(Allocator *)0x0);
  benchmark("squeezenet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe3,0xe3,3,4,(Allocator *)0x0);
  benchmark("squeezenet_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("mobilenet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("mobilenet_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("mobilenet_v2",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("mobilenet_v3",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("shufflenet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("shufflenet_v2",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("mnasnet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("proxylessnasnet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("efficientnet_b0",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("efficientnetv2_b0",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("regnety_400m",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0x80,0x80,3,4,(Allocator *)0x0);
  benchmark("blazeface",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("googlenet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("googlenet_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("resnet18",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("resnet18_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe3,0xe3,3,4,(Allocator *)0x0);
  benchmark("alexnet",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("vgg16",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("vgg16_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("resnet50",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0xe0,0xe0,3,4,(Allocator *)0x0);
  benchmark("resnet50_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,300,300,3,4,(Allocator *)0x0);
  benchmark("squeezenet_ssd",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,300,300,3,4,(Allocator *)0x0);
  benchmark("squeezenet_ssd_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,300,300,3,4,(Allocator *)0x0);
  benchmark("mobilenet_ssd",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,300,300,3,4,(Allocator *)0x0);
  benchmark("mobilenet_ssd_int8",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0x1a0,0x1a0,3,4,(Allocator *)0x0);
  benchmark("mobilenet_yolo",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0x160,0x160,3,4,(Allocator *)0x0);
  benchmark("mobilenetv2_yolov3",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0x1a0,0x1a0,3,4,(Allocator *)0x0);
  benchmark("yolov4-tiny",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  ncnn::Mat::Mat(&MStack_b8,0x140,0x140,3,4,(Allocator *)0x0);
  benchmark("nanodet_m",&MStack_b8,&local_70);
  ncnn::Mat::~Mat(&MStack_b8);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    int loop_count = 4;
    int num_threads = ncnn::get_cpu_count();
    int powersave = 0;
    int gpu_device = -1;
    int cooling_down = 1;

    if (argc >= 2)
    {
        loop_count = atoi(argv[1]);
    }
    if (argc >= 3)
    {
        num_threads = atoi(argv[2]);
    }
    if (argc >= 4)
    {
        powersave = atoi(argv[3]);
    }
    if (argc >= 5)
    {
        gpu_device = atoi(argv[4]);
    }
    if (argc >= 6)
    {
        cooling_down = atoi(argv[5]);
    }

#ifdef __EMSCRIPTEN__
    EM_ASM(
        FS.mkdir('/working');
        FS.mount(NODEFS, {root: '.'}, '/working'););
#endif // __EMSCRIPTEN__

    bool use_vulkan_compute = gpu_device != -1;

    g_enable_cooling_down = cooling_down != 0;

    g_loop_count = loop_count;

    g_blob_pool_allocator.set_size_compare_ratio(0.0f);
    g_workspace_pool_allocator.set_size_compare_ratio(0.5f);

#if NCNN_VULKAN
    if (use_vulkan_compute)
    {
        g_warmup_loop_count = 10;

        g_vkdev = ncnn::get_gpu_device(gpu_device);

        g_blob_vkallocator = new ncnn::VkBlobAllocator(g_vkdev);
        g_staging_vkallocator = new ncnn::VkStagingAllocator(g_vkdev);
    }
#endif // NCNN_VULKAN

    // default option
    ncnn::Option opt;
    opt.lightmode = true;
    opt.num_threads = num_threads;
    opt.blob_allocator = &g_blob_pool_allocator;
    opt.workspace_allocator = &g_workspace_pool_allocator;
#if NCNN_VULKAN
    opt.blob_vkallocator = g_blob_vkallocator;
    opt.workspace_vkallocator = g_blob_vkallocator;
    opt.staging_vkallocator = g_staging_vkallocator;
#endif // NCNN_VULKAN
    opt.use_winograd_convolution = true;
    opt.use_sgemm_convolution = true;
    opt.use_int8_inference = true;
    opt.use_vulkan_compute = use_vulkan_compute;
    opt.use_fp16_packed = true;
    opt.use_fp16_storage = true;
    opt.use_fp16_arithmetic = true;
    opt.use_int8_storage = true;
    opt.use_int8_arithmetic = true;
    opt.use_packing_layout = true;
    opt.use_shader_pack8 = false;
    opt.use_image_storage = false;

    ncnn::set_cpu_powersave(powersave);

    ncnn::set_omp_dynamic(0);
    ncnn::set_omp_num_threads(num_threads);

    fprintf(stderr, "loop_count = %d\n", g_loop_count);
    fprintf(stderr, "num_threads = %d\n", num_threads);
    fprintf(stderr, "powersave = %d\n", ncnn::get_cpu_powersave());
    fprintf(stderr, "gpu_device = %d\n", gpu_device);
    fprintf(stderr, "cooling_down = %d\n", (int)g_enable_cooling_down);

    // run
    benchmark("squeezenet", ncnn::Mat(227, 227, 3), opt);

    benchmark("squeezenet_int8", ncnn::Mat(227, 227, 3), opt);

    benchmark("mobilenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_v2", ncnn::Mat(224, 224, 3), opt);

    // benchmark("mobilenet_v2_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("mobilenet_v3", ncnn::Mat(224, 224, 3), opt);

    benchmark("shufflenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("shufflenet_v2", ncnn::Mat(224, 224, 3), opt);

    benchmark("mnasnet", ncnn::Mat(224, 224, 3), opt);

    benchmark("proxylessnasnet", ncnn::Mat(224, 224, 3), opt);

    benchmark("efficientnet_b0", ncnn::Mat(224, 224, 3), opt);

    benchmark("efficientnetv2_b0", ncnn::Mat(224, 224, 3), opt);

    benchmark("regnety_400m", ncnn::Mat(224, 224, 3), opt);

    benchmark("blazeface", ncnn::Mat(128, 128, 3), opt);

    benchmark("googlenet", ncnn::Mat(224, 224, 3), opt);

    benchmark("googlenet_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet18", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet18_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("alexnet", ncnn::Mat(227, 227, 3), opt);

    benchmark("vgg16", ncnn::Mat(224, 224, 3), opt);

    benchmark("vgg16_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet50", ncnn::Mat(224, 224, 3), opt);

    benchmark("resnet50_int8", ncnn::Mat(224, 224, 3), opt);

    benchmark("squeezenet_ssd", ncnn::Mat(300, 300, 3), opt);

    benchmark("squeezenet_ssd_int8", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_ssd", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_ssd_int8", ncnn::Mat(300, 300, 3), opt);

    benchmark("mobilenet_yolo", ncnn::Mat(416, 416, 3), opt);

    benchmark("mobilenetv2_yolov3", ncnn::Mat(352, 352, 3), opt);

    benchmark("yolov4-tiny", ncnn::Mat(416, 416, 3), opt);

    benchmark("nanodet_m", ncnn::Mat(320, 320, 3), opt);

#if NCNN_VULKAN
    delete g_blob_vkallocator;
    delete g_staging_vkallocator;
#endif // NCNN_VULKAN

    return 0;
}